

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
stringToUnits_bitsBytes_Test::stringToUnits_bitsBytes_Test(stringToUnits_bitsBytes_Test *this)

{
  stringToUnits_bitsBytes_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__stringToUnits_bitsBytes_Test_002f99d0;
  return;
}

Assistant:

TEST(stringToUnits, bitsBytes)
{
    auto res = unit_from_string("KiB");
    EXPECT_EQ(res, precise::kibi * precise::data::byte);

    res = unit_from_string("Mib");
    EXPECT_EQ(res, precise::mebi * precise::data::bit);

    res = unit_from_string("MAB");
    EXPECT_EQ(res, precise::mega * precise::data::byte);

    res = unit_from_string("MAb");
    EXPECT_EQ(res, precise::mega * precise::data::bit);
}